

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Privkey * __thiscall cfd::core::Privkey::CreateNegate(Privkey *__return_storage_ptr__,Privkey *this)

{
  undefined1 local_30 [8];
  ByteData negated;
  Privkey *this_local;
  
  negated.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  WallyUtil::NegatePrivkey((ByteData *)local_30,&this->data_);
  Privkey(__return_storage_ptr__,(ByteData *)local_30,kMainnet,true);
  ByteData::~ByteData((ByteData *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Privkey Privkey::CreateNegate() const {
  ByteData negated = WallyUtil::NegatePrivkey(data_);
  return Privkey(negated);
}